

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void getLpMatrixCoefficient(HighsLp *lp,HighsInt Xrow,HighsInt Xcol,double *val)

{
  const_reference pvVar1;
  const_reference pvVar2;
  value_type *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HighsInt el;
  HighsInt get_el;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = -1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)in_EDX);
  local_20 = *pvVar1;
  do {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)(in_EDX + 1));
    if (*pvVar1 <= local_20) {
LAB_004fde6b:
      if (local_1c < 0) {
        *in_RCX = 0.0;
      }
      else {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd8),
                            (long)local_1c);
        *in_RCX = *pvVar2;
      }
      return;
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)local_20);
    if (*pvVar1 == in_ESI) {
      local_1c = local_20;
      goto LAB_004fde6b;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void getLpMatrixCoefficient(const HighsLp& lp, const HighsInt Xrow,
                            const HighsInt Xcol, double* val) {
  assert(0 <= Xrow && Xrow < lp.num_row_);
  assert(0 <= Xcol && Xcol < lp.num_col_);

  HighsInt get_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[Xcol];
       el < lp.a_matrix_.start_[Xcol + 1]; el++) {
    if (lp.a_matrix_.index_[el] == Xrow) {
      get_el = el;
      break;
    }
  }
  if (get_el < 0) {
    *val = 0;
  } else {
    *val = lp.a_matrix_.value_[get_el];
  }
}